

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

optional<bool> __thiscall
wallet::CWallet::IsInternalScriptPubKeyMan(CWallet *this,ScriptPubKeyMan *spk_man)

{
  ScriptPubKeyMan *pSVar1;
  element_type eVar2;
  ushort uVar3;
  int iVar4;
  DescriptorScriptPubKeyMan *this_00;
  uint extraout_var;
  _Base_ptr p_Var5;
  DescriptorScriptPubKeyMan *pDVar6;
  runtime_error *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  _Base_ptr p_Var8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ushort uVar10;
  _Rb_tree_header *p_Var11;
  _Base_ptr p_Var12;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock67;
  undefined1 local_148 [16];
  element_type local_138;
  _Base_ptr p_Stack_130;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_100;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_c8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_90;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) == 0) {
LAB_00c2cb5b:
    uVar10 = 0;
    uVar3 = 0;
  }
  else {
    GetActiveScriptPubKeyMans
              ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                *)local_148,this);
    if ((_Base_ptr)local_138._vptr_Descriptor == (_Base_ptr)0x0) {
LAB_00c2cb53:
      std::
      _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                   *)local_148);
      goto LAB_00c2cb5b;
    }
    eVar2._vptr_Descriptor = local_138._vptr_Descriptor;
    p_Var5 = (_Base_ptr)(local_148 + 8);
    do {
      p_Var12 = p_Var5;
      p_Var8 = (_Base_ptr)eVar2._vptr_Descriptor;
      pSVar1 = *(ScriptPubKeyMan **)(p_Var8 + 1);
      p_Var5 = p_Var8;
      if (pSVar1 < spk_man) {
        p_Var5 = p_Var12;
      }
      eVar2._vptr_Descriptor = (_func_int **)(&p_Var8->_M_left)[pSVar1 < spk_man];
    } while ((&p_Var8->_M_left)[pSVar1 < spk_man] != (_Base_ptr)0x0);
    if (p_Var5 == (_Base_ptr)(local_148 + 8)) goto LAB_00c2cb53;
    if (pSVar1 < spk_man) {
      p_Var8 = p_Var12;
    }
    pSVar1 = *(ScriptPubKeyMan **)(p_Var8 + 1);
    std::
    _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
    ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                 *)local_148);
    if (spk_man < pSVar1) goto LAB_00c2cb5b;
    if (spk_man == (ScriptPubKeyMan *)0x0) {
LAB_00c2cb96:
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_58._0_8_ = local_58 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,"IsInternalScriptPubKeyMan","");
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                      ": unexpected ScriptPubKeyMan type.");
      local_148._0_8_ = (pbVar7->_M_dataplus)._M_p;
      paVar9 = &pbVar7->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._0_8_ == paVar9) {
        local_138._vptr_Descriptor = (_func_int **)paVar9->_M_allocated_capacity;
        p_Stack_130 = *(_Base_ptr *)((long)&pbVar7->field_2 + 8);
        local_148._0_8_ = &local_138;
      }
      else {
        local_138._vptr_Descriptor = (_func_int **)paVar9->_M_allocated_capacity;
      }
      local_148._8_8_ = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      std::runtime_error::runtime_error(this_01,(string *)local_148);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00c2cd3e;
    }
    this_00 = (DescriptorScriptPubKeyMan *)
              __dynamic_cast(spk_man,&ScriptPubKeyMan::typeinfo,&DescriptorScriptPubKeyMan::typeinfo
                             ,0);
    if (this_00 == (DescriptorScriptPubKeyMan *)0x0) goto LAB_00c2cb96;
    local_58._0_8_ = &this_00->cs_desc_man;
    local_58[8] = false;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_58);
    DescriptorScriptPubKeyMan::GetWalletDescriptor((WalletDescriptor *)local_148,this_00);
    iVar4 = (*(*(_func_int ***)local_148._0_8_)[0xb])();
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_90);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_c8);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_100);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
    }
    if ((extraout_var & 1) == 0) {
      __assert_fail("type.has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                    ,0xf35,
                    "std::optional<bool> wallet::CWallet::IsInternalScriptPubKeyMan(ScriptPubKeyMan *) const"
                   );
    }
    p_Var5 = (this->m_internal_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var5 == (_Base_ptr)0x0) {
LAB_00c2cb36:
      pDVar6 = (DescriptorScriptPubKeyMan *)0x0;
    }
    else {
      p_Var11 = &(this->m_internal_spk_managers)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = &p_Var11->_M_header;
      do {
        if (iVar4 <= (int)p_Var5[1]._M_color) {
          p_Var8 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < iVar4];
      } while (p_Var5 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var8 == p_Var11) || (iVar4 < (int)p_Var8[1]._M_color))
      goto LAB_00c2cb36;
      pDVar6 = (DescriptorScriptPubKeyMan *)p_Var8[1]._M_parent;
    }
    uVar10 = (ushort)(pDVar6 == this_00);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)local_58);
    uVar3 = 0x100;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)(uVar3 | uVar10);
  }
LAB_00c2cd3e:
  __stack_chk_fail();
}

Assistant:

std::optional<bool> CWallet::IsInternalScriptPubKeyMan(ScriptPubKeyMan* spk_man) const
{
    // Legacy script pubkey man can't be either external or internal
    if (IsLegacy()) {
        return std::nullopt;
    }

    // only active ScriptPubKeyMan can be internal
    if (!GetActiveScriptPubKeyMans().count(spk_man)) {
        return std::nullopt;
    }

    const auto desc_spk_man = dynamic_cast<DescriptorScriptPubKeyMan*>(spk_man);
    if (!desc_spk_man) {
        throw std::runtime_error(std::string(__func__) + ": unexpected ScriptPubKeyMan type.");
    }

    LOCK(desc_spk_man->cs_desc_man);
    const auto& type = desc_spk_man->GetWalletDescriptor().descriptor->GetOutputType();
    assert(type.has_value());

    return GetScriptPubKeyMan(*type, /* internal= */ true) == desc_spk_man;
}